

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

double duckdb::SqrtOperator::Operation<double,double>(double input)

{
  OutOfRangeException *this;
  double in_XMM0_Qa;
  double dVar1;
  allocator local_29;
  string local_28 [40];
  
  if (in_XMM0_Qa < 0.0) {
    this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"cannot take square root of a negative number",&local_29);
    duckdb::OutOfRangeException::OutOfRangeException(this,local_28);
    __cxa_throw(this,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  dVar1 = sqrt(in_XMM0_Qa);
  return dVar1;
}

Assistant:

static inline TR Operation(TA input) {
		if (input < 0) {
			throw OutOfRangeException("cannot take square root of a negative number");
		}
		return std::sqrt(input);
	}